

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

void Gia_ManPerformOneIter(Gia_ManEra_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  pGVar2 = p->pAig;
  if (1 < pGVar2->nObjs) {
    pGVar3 = pGVar2->pObjs;
    lVar6 = 1;
    do {
      uVar8 = *(ulong *)(pGVar3 + lVar6);
      uVar10 = (uint)uVar8;
      iVar5 = (int)lVar6;
      if ((uVar8 & 0x1fffffff) == 0x1fffffff || (int)uVar10 < 0) {
        if ((int)uVar10 < 0 && (int)(uVar8 & 0x1fffffff) != 0x1fffffff) {
          uVar1 = p->nWordsSim;
          puVar4 = p->pDataSim;
          if ((uVar10 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar8 = (ulong)uVar1 + 1;
              do {
                puVar4[(long)(int)(uVar1 * iVar5) + (uVar8 - 2)] =
                     puVar4[(long)(int)((iVar5 - (uVar10 & 0x1fffffff)) * uVar1) + (uVar8 - 2)];
                uVar8 = uVar8 - 1;
              } while (1 < uVar8);
            }
          }
          else if (0 < (int)uVar1) {
            uVar8 = (ulong)uVar1 + 1;
            do {
              puVar4[(long)(int)(uVar1 * iVar5) + (uVar8 - 2)] =
                   ~puVar4[(long)(int)((iVar5 - (uVar10 & 0x1fffffff)) * uVar1) + (uVar8 - 2)];
              uVar8 = uVar8 - 1;
            } while (1 < uVar8);
          }
        }
      }
      else {
        uVar1 = p->nWordsSim;
        uVar11 = (ulong)uVar1;
        puVar4 = p->pDataSim;
        uVar9 = uVar10 & 0x1fffffff;
        uVar7 = (uint)(uVar8 >> 0x20) & 0x1fffffff;
        if ((uVar10 >> 0x1d & 1) == 0) {
          if ((uVar8 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar11 = uVar11 + 1;
              do {
                puVar4[(long)(int)(uVar1 * iVar5) + (uVar11 - 2)] =
                     puVar4[(long)(int)((iVar5 - uVar7) * uVar1) + (uVar11 - 2)] &
                     puVar4[(long)(int)((iVar5 - uVar9) * uVar1) + (uVar11 - 2)];
                uVar11 = uVar11 - 1;
              } while (1 < uVar11);
            }
          }
          else if (0 < (int)uVar1) {
            uVar11 = uVar11 + 1;
            do {
              puVar4[(long)(int)(uVar1 * iVar5) + (uVar11 - 2)] =
                   ~puVar4[(long)(int)((iVar5 - uVar7) * uVar1) + (uVar11 - 2)] &
                   puVar4[(long)(int)((iVar5 - uVar9) * uVar1) + (uVar11 - 2)];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
        else if ((uVar8 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar1) {
            uVar11 = uVar11 + 1;
            do {
              puVar4[(long)(int)(uVar1 * iVar5) + (uVar11 - 2)] =
                   ~puVar4[(long)(int)((iVar5 - uVar9) * uVar1) + (uVar11 - 2)] &
                   puVar4[(long)(int)((iVar5 - uVar7) * uVar1) + (uVar11 - 2)];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
        else if (0 < (int)uVar1) {
          uVar11 = uVar11 + 1;
          do {
            puVar4[(long)(int)(uVar1 * iVar5) + (uVar11 - 2)] =
                 ~(puVar4[(long)(int)((iVar5 - uVar7) * uVar1) + (uVar11 - 2)] |
                  puVar4[(long)(int)((iVar5 - uVar9) * uVar1) + (uVar11 - 2)]);
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pGVar2->nObjs);
  }
  return;
}

Assistant:

void Gia_ManPerformOneIter( Gia_ManEra_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimulateNode( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManSimulateCo( p, pObj );
    }
}